

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

void __thiscall
tetgenmesh::save_segmentpoint_insradius(tetgenmesh *this,point segpt,point parentpt,double r)

{
  verttype vVar1;
  int iVar2;
  shellface ppdVar3;
  double dVar4;
  double dVar5;
  undefined1 local_78 [8];
  face parentsh;
  face parentseg;
  face parentseg2;
  face parentseg1;
  double rp;
  double rv;
  double r_local;
  point parentpt_local;
  point segpt_local;
  tetgenmesh *this_local;
  
  vVar1 = pointtype(this,parentpt);
  if (vVar1 == FREESEGVERTEX) {
    face::face((face *)&parentseg2.shver);
    face::face((face *)&parentseg.shver);
    ppdVar3 = point2sh(this,segpt);
    sdecode(this,ppdVar3,(face *)&parentseg2.shver);
    ppdVar3 = point2sh(this,parentpt);
    sdecode(this,ppdVar3,(face *)&parentseg.shver);
    iVar2 = segsegadjacent(this,(face *)&parentseg2.shver,(face *)&parentseg.shver);
    rp = r;
    if ((iVar2 != 0) && (dVar4 = getpointinsradius(this,parentpt), rp = r, r < dVar4)) {
      rp = dVar4;
    }
  }
  else {
    vVar1 = pointtype(this,parentpt);
    rp = r;
    if (vVar1 == FREEFACETVERTEX) {
      face::face((face *)&parentsh.shver);
      face::face((face *)local_78);
      ppdVar3 = point2sh(this,segpt);
      sdecode(this,ppdVar3,(face *)&parentsh.shver);
      ppdVar3 = point2sh(this,parentpt);
      sdecode(this,ppdVar3,(face *)local_78);
      iVar2 = segfacetadjacent(this,(face *)&parentsh.shver,(face *)local_78);
      rp = r;
      if (iVar2 != 0) {
        dVar4 = getpointinsradius(this,parentpt);
        dVar5 = sqrt(2.0);
        rp = r;
        if (dVar5 * r < dVar4) {
          dVar5 = sqrt(2.0);
          rp = dVar4 / dVar5;
        }
      }
    }
  }
  setpointinsradius(this,segpt,rp);
  return;
}

Assistant:

void tetgenmesh::save_segmentpoint_insradius(point segpt,point parentpt,REAL r)
{
  REAL rv = r, rp;
  if (pointtype(parentpt) == FREESEGVERTEX) {
    face parentseg1, parentseg2;
    sdecode(point2sh(segpt), parentseg1);
    sdecode(point2sh(parentpt), parentseg2);
    if (segsegadjacent(&parentseg1, &parentseg2)) {
      rp = getpointinsradius(parentpt);
      if (rv < rp) {
        // The relaxed insertion radius of 'newpt'.
        rv = rp; 
      }
    }
  } else if (pointtype(parentpt) == FREEFACETVERTEX) {
    face parentseg, parentsh;
    sdecode(point2sh(segpt), parentseg);
    sdecode(point2sh(parentpt), parentsh);
    if (segfacetadjacent(&parentseg, &parentsh)) {
      rp = getpointinsradius(parentpt);
      if ((sqrt(2.0) * rv) < rp) { // if (rv < rp) {
        // The relaxed insertion radius of 'newpt'.
        rv = rp / sqrt(2.0); // rv = rp; 
      }
    }
  }
  setpointinsradius(segpt, rv);
}